

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult *
iutest::internal::backward::NeHelper<false>::CmpHelper<std::vector<int,_std::allocator<int>_>,_true>
::Compare(AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,
         vector<int,_std::allocator<int>_> *val1,vector<int,_std::allocator<int>_> *val2)

{
  vector<int,_std::allocator<int>_> *in_R9;
  vector<int,_std::allocator<int>_> *val2_local;
  vector<int,_std::allocator<int>_> *val1_local;
  char *expr2_local;
  char *expr1_local;
  
  CmpHelperNE<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            (__return_storage_ptr__,(internal *)expr1,expr2,(char *)val1,val2,in_R9);
  return __return_storage_ptr__;
}

Assistant:

static AssertionResult Compare(const char* expr1, const char* expr2, const T& val1, const T& val2)
        {
            return CmpHelperNE(expr1, expr2, val1, val2);
        }